

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void CKSYMS_STR(Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *kname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type in_RDI;
  size_type in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_00000020,in_stack_00000018);
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"H2");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"O2");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"H2O");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"H");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"O");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"OH");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"HO2");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"H2O2");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](kname,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"N2");
  return;
}

Assistant:

void
CKSYMS_STR(amrex::Vector<std::string>& kname)
{
  kname.resize(9);
  kname[0] = "H2";
  kname[1] = "O2";
  kname[2] = "H2O";
  kname[3] = "H";
  kname[4] = "O";
  kname[5] = "OH";
  kname[6] = "HO2";
  kname[7] = "H2O2";
  kname[8] = "N2";
}